

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

void load_bitmap(void)

{
  byte bVar1;
  ushort uVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  undefined1 auVar5 [12];
  Am_Object local_40;
  Am_Image_Array local_38 [8];
  Am_Style local_30 [12];
  undefined4 local_24;
  undefined8 local_20;
  Am_Image_Array local_18 [8];
  Am_Image_Array amulet_icon_image;
  char *filename;
  
  _amulet_icon_image = (char *)Am_Merge_Pathname("images/amuletside.xbm");
  Am_Image_Array::Am_Image_Array(local_18,_amulet_icon_image);
  if (_amulet_icon_image != (char *)0x0) {
    operator_delete__(_amulet_icon_image);
  }
  bVar1 = Am_Image_Array::Valid();
  if ((bVar1 & 1) == 0) {
    auVar5 = Am_Error("Amulet bitmap image not found");
    local_24 = auVar5._8_4_;
    local_20 = auVar5._0_8_;
    Am_Image_Array::~Am_Image_Array(local_18);
    _Unwind_Resume(local_20);
  }
  Am_Image_Array::Am_Image_Array(local_38,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x3f59999a,0x3f400000,0x3f733333,local_30,0,1,0,0,
                     &Am_DEFAULT_DASH_LIST,2,0,0,local_38);
  Am_Style::operator=((Am_Style *)&Amulet_Dark_Purple,local_30);
  Am_Style::~Am_Style(local_30);
  Am_Image_Array::~Am_Image_Array(local_38);
  Am_Object::Create((char *)&local_40);
  pAVar3 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_18);
  uVar2 = Am_Object::Set((ushort)&local_40,(Am_Wrapper *)0xb0,(ulong)pAVar3);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar3);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::operator=(&amulet_icon,pAVar4);
  Am_Object::~Am_Object(&local_40);
  Am_Image_Array::~Am_Image_Array(local_18);
  return;
}

Assistant:

void
load_bitmap()
{
  const char *filename = Am_Merge_Pathname(AMULET_BITMAP);
  Am_Image_Array amulet_icon_image(filename);
  delete[] filename;
  if (!amulet_icon_image.Valid())
    Am_Error("Amulet bitmap image not found");
  Amulet_Dark_Purple = Am_Style(0.85f, 0.75f, 0.95f);
  amulet_icon = Am_Bitmap.Create("Amulet_Icon")
                    .Set(Am_IMAGE, amulet_icon_image)
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_No_Style);
}